

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_file.cpp
# Opt level: O0

void __thiscall MemoryFile_CrazyWriteSize_Test::TestBody(MemoryFile_CrazyWriteSize_Test *this)

{
  anon_class_16_2_64db24bb fn;
  element_type *__first;
  element_type *peVar1;
  char *local_a0;
  char *source;
  unsigned_long length;
  shared_ptr<void> local_88;
  undefined1 local_78 [8];
  in_memory mf;
  uchar local_29;
  undefined1 local_28 [8];
  buffer buffer;
  size_t elements;
  MemoryFile_CrazyWriteSize_Test *this_local;
  
  buffer.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa;
  anon_unknown.dwarf_16883::MemoryFile::make_buffer((MemoryFile *)local_28,10);
  __first = std::__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>::get
                      ((__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2> *)local_28);
  peVar1 = std::__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2> *)local_28);
  local_29 = '\0';
  std::fill<unsigned_char*,unsigned_char>(__first,peVar1 + 10,&local_29);
  std::shared_ptr<void>::shared_ptr<unsigned_char,void>
            (&local_88,(shared_ptr<unsigned_char> *)local_28);
  pstore::file::in_memory::in_memory((in_memory *)local_78,&local_88,10,0,true);
  std::shared_ptr<void>::~shared_ptr(&local_88);
  length._4_4_ = std::numeric_limits<unsigned_int>::max();
  pstore::file::file_base::write<unsigned_int,void>
            ((file_base *)local_78,(uint *)((long)&length + 4));
  pstore::file::in_memory::seek((in_memory *)local_78,4);
  source = (char *)0xfffffffffffffffd;
  local_a0 = "Hello";
  fn.source = &local_a0;
  fn.mf = (in_memory *)local_78;
  check_for_error<MemoryFile_CrazyWriteSize_Test::TestBody()::__0>(fn,invalid_argument);
  pstore::file::in_memory::~in_memory((in_memory *)local_78);
  std::shared_ptr<unsigned_char>::~shared_ptr((shared_ptr<unsigned_char> *)local_28);
  return;
}

Assistant:

TEST_F (MemoryFile, CrazyWriteSize) {
    constexpr std::size_t elements = 10;
    auto buffer = MemoryFile::make_buffer (elements);
    std::fill (buffer.get (), buffer.get () + elements, std::uint8_t{0});
    pstore::file::in_memory mf (buffer, elements);

    mf.write (std::numeric_limits<std::uint32_t>::max ());
    mf.seek (4);
    constexpr auto length = std::numeric_limits<std::size_t>::max () - std::size_t{2};
    char const * source = "Hello";
    check_for_error ([&] { mf.write_buffer (source, length); }, std::errc::invalid_argument);
}